

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::ShadeVertsLinearColorGradientKeepAlpha
               (ImDrawList *draw_list,int vert_start_idx,int vert_end_idx,ImVec2 gradient_p0,
               ImVec2 gradient_p1,ImU32 col0,ImU32 col1)

{
  uint in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  float fVar1;
  int b;
  int g;
  int r;
  float t;
  float d;
  ImDrawVert *vert;
  int col_delta_b;
  int col_delta_g;
  int col_delta_r;
  int col0_b;
  int col0_g;
  int col0_r;
  ImDrawVert *vert_end;
  ImDrawVert *vert_start;
  float gradient_inv_length2;
  ImVec2 gradient_extent;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  ImVec2 local_74;
  float local_6c;
  ulong local_68;
  int local_60;
  int local_5c;
  int local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  ulong local_48;
  ulong local_40;
  float local_34;
  ImVec2 local_30;
  uint local_28;
  uint local_24;
  int local_20;
  int local_1c;
  long local_18;
  
  local_28 = in_R8D;
  local_24 = in_ECX;
  local_20 = in_EDX;
  local_1c = in_ESI;
  local_18 = in_RDI;
  local_30 = operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                       (ImVec2 *)0x15be2e);
  local_34 = ImLengthSqr(&local_30);
  local_34 = 1.0 / local_34;
  local_48 = *(long *)(local_18 + 0x28) + (long)local_20 * 0x14;
  local_4c = local_24 & 0xff;
  local_50 = local_24 >> 8 & 0xff;
  local_54 = local_24 >> 0x10 & 0xff;
  local_58 = (local_28 & 0xff) - local_4c;
  local_5c = (local_28 >> 8 & 0xff) - local_50;
  local_60 = (local_28 >> 0x10 & 0xff) - local_54;
  local_68 = *(long *)(local_18 + 0x28) + (long)local_1c * 0x14;
  local_40 = local_68;
  for (; local_68 < local_48; local_68 = local_68 + 0x14) {
    local_74 = operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                         (ImVec2 *)0x15bf1f);
    local_6c = ImDot(&local_74,&local_30);
    fVar1 = ImClamp<float>(local_6c * local_34,0.0,1.0);
    in_stack_ffffffffffffff7c = (int)((float)local_60 * fVar1 + (float)(int)local_54);
    *(uint *)(local_68 + 0x10) =
         (int)((float)local_58 * fVar1 + (float)(int)local_4c) |
         (int)((float)local_5c * fVar1 + (float)(int)local_50) << 8 |
         in_stack_ffffffffffffff7c << 0x10 | *(uint *)(local_68 + 0x10) & 0xff000000;
  }
  return;
}

Assistant:

void ImGui::ShadeVertsLinearColorGradientKeepAlpha(ImDrawList* draw_list, int vert_start_idx, int vert_end_idx, ImVec2 gradient_p0, ImVec2 gradient_p1, ImU32 col0, ImU32 col1)
{
    ImVec2 gradient_extent = gradient_p1 - gradient_p0;
    float gradient_inv_length2 = 1.0f / ImLengthSqr(gradient_extent);
    ImDrawVert* vert_start = draw_list->VtxBuffer.Data + vert_start_idx;
    ImDrawVert* vert_end = draw_list->VtxBuffer.Data + vert_end_idx;
    const int col0_r = (int)(col0 >> IM_COL32_R_SHIFT) & 0xFF;
    const int col0_g = (int)(col0 >> IM_COL32_G_SHIFT) & 0xFF;
    const int col0_b = (int)(col0 >> IM_COL32_B_SHIFT) & 0xFF;
    const int col_delta_r = ((int)(col1 >> IM_COL32_R_SHIFT) & 0xFF) - col0_r;
    const int col_delta_g = ((int)(col1 >> IM_COL32_G_SHIFT) & 0xFF) - col0_g;
    const int col_delta_b = ((int)(col1 >> IM_COL32_B_SHIFT) & 0xFF) - col0_b;
    for (ImDrawVert* vert = vert_start; vert < vert_end; vert++)
    {
        float d = ImDot(vert->pos - gradient_p0, gradient_extent);
        float t = ImClamp(d * gradient_inv_length2, 0.0f, 1.0f);
        int r = (int)(col0_r + col_delta_r * t);
        int g = (int)(col0_g + col_delta_g * t);
        int b = (int)(col0_b + col_delta_b * t);
        vert->col = (r << IM_COL32_R_SHIFT) | (g << IM_COL32_G_SHIFT) | (b << IM_COL32_B_SHIFT) | (vert->col & IM_COL32_A_MASK);
    }
}